

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

void sysbvm_dwarf_cfi_saveFramePointerInRegister
               (sysbvm_dwarf_cfi_builder_t *cfi,uintptr_t reg,intptr_t offset)

{
  size_t sVar1;
  
  if (cfi->hasFramePointerRegister == true) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/dwarf.c:287: assertion failure: !cfi->hasFramePointerRegister"
              );
  }
  if ((offset & 7U) != 0) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/dwarf.c:288: assertion failure: (offset % sizeof(uintptr_t)) == 0"
              );
  }
  cfi->hasFramePointerRegister = true;
  cfi->framePointerRegister = reg;
  sVar1 = cfi->stackFrameSize - ((ulong)offset >> 3);
  cfi->stackFrameSizeAtFramePointer = sVar1;
  sysbvm_dwarf_cfi_cfaInRegisterWithOffset(cfi,reg,sVar1 * 8);
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_cfi_saveFramePointerInRegister(sysbvm_dwarf_cfi_builder_t *cfi, uintptr_t reg, intptr_t offset)
{
    SYSBVM_ASSERT(!cfi->hasFramePointerRegister);
    SYSBVM_ASSERT((offset % sizeof(uintptr_t)) == 0);

    cfi->hasFramePointerRegister = true;
    cfi->framePointerRegister = reg;
    cfi->stackFrameSizeAtFramePointer = cfi->stackFrameSize - offset / sizeof(uintptr_t);
    sysbvm_dwarf_cfi_cfaInRegisterWithFactoredOffset(cfi, reg, cfi->stackFrameSizeAtFramePointer);
}